

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::SplitNDLayerParams::ByteSizeLong(SplitNDLayerParams *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int64 iVar4;
  uint64 uVar5;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  SplitNDLayerParams *this_local;
  
  data_size = 0;
  sVar2 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->splitsizes_);
  if (sVar2 != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar2);
    data_size = sVar3 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar2);
  this->_splitsizes_cached_byte_size_ = iVar1;
  data_size = sVar2 + data_size;
  iVar4 = axis(this);
  if (iVar4 != 0) {
    iVar4 = axis(this);
    sVar2 = google::protobuf::internal::WireFormatLite::Int64Size(iVar4);
    data_size = sVar2 + 1 + data_size;
  }
  uVar5 = numsplits(this);
  if (uVar5 != 0) {
    uVar5 = numsplits(this);
    sVar2 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar5);
    data_size = sVar2 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar1;
  return data_size;
}

Assistant:

size_t SplitNDLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SplitNDLayerParams)
  size_t total_size = 0;

  // repeated uint64 splitSizes = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->splitsizes_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _splitsizes_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // int64 axis = 1;
  if (this->axis() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->axis());
  }

  // uint64 numSplits = 2;
  if (this->numsplits() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->numsplits());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}